

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

boolean_validator __thiscall goodform::sub_form::boolean(sub_form *this)

{
  bool bVar1;
  bool *pbVar2;
  byte local_81;
  allocator<char> local_59;
  string local_58;
  error_message local_38;
  sub_form *local_18;
  sub_form *this_local;
  boolean_validator ret;
  
  local_18 = this;
  bVar1 = is<bool>(this->variant_);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"TYPE NOT BOOLEAN",&local_59);
    error_message::error_message(&local_38,&local_58);
    error_message::operator=(this->error_,&local_38);
    error_message::~error_message(&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  bVar1 = is<bool>(this->variant_);
  if (bVar1) {
    pbVar2 = get<bool>(this->variant_);
    local_81 = *pbVar2;
  }
  else {
    local_81 = 0;
  }
  boolean_validator::boolean_validator
            ((boolean_validator *)((long)&this_local + 7),(bool)(local_81 & 1));
  return (boolean_validator)(bool)this_local._7_1_;
}

Assistant:

boolean_validator sub_form::boolean()
  {
    if (!is<bool>(this->variant_))
      this->error_ = error_message("TYPE NOT BOOLEAN");

    boolean_validator ret(is<bool>(this->variant_) ? get<bool>(this->variant_) : false);
    return ret;
  }